

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::OutputWheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  pointer piVar7;
  int in_R9D;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  piVar4 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 != piVar3) {
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (this->outputFlags_[*piVar4] ^ 1);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar3);
    if (iVar6 == 2) {
      return;
    }
  }
  bVar2 = this->ordFlag_;
  iVar6 = ((uint)bVar2 + (uint)bVar2 ^ 2) + (uint)bVar2 + (uint)bVar2 * 2;
  if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::vector<int,_std::allocator<int>_>::vector(&local_48,handles);
    WheatsheafAndWheatsheafMean
              (this,&local_48,GetOutLoss,in_R9D,iVar6,eptype * (uint)bVar2,eptype_tvar);
    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector(&local_60,handles);
    WheatsheafAndWheatsheafMeanWithWeighting
              (this,&local_60,GetOutLoss,in_R9D,iVar6,eptype * (uint)bVar2,eptype_tvar);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((this->ordFlag_ == false) &&
     ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var5 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        ensemble.first = p_Var5[1]._M_color;
        std::vector<int,_std::allocator<int>_>::vector
                  (&ensemble.second,(vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent);
        if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::vector<int,_std::allocator<int>_>::vector(&local_90,handles);
          WheatsheafAndWheatsheafMean
                    (this,&local_90,GetOutLoss,in_R9D,iVar6,ensemble.first,eptype_tvar);
          piVar7 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector(&local_78,handles);
          WheatsheafAndWheatsheafMeanWithWeighting
                    (this,&local_78,GetOutLoss,in_R9D,iVar6,ensemble.first,eptype_tvar);
          piVar7 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        if (piVar7 != (pointer)0x0) {
          operator_delete(piVar7);
        }
        if (ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
  }
  return;
}

Assistant:

void aggreports::OutputWheatsheafAndWheatsheafMean(const std::vector<int> &handles,
	int eptype, const int eptype_tvar,
	OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  int falseCount = 0;
  for (auto it = handles.begin(); it != handles.end(); ++it) {
    if (outputFlags_[*it] == false) falseCount++;
  }
  if (falseCount == 2) return;

  // EPCalc = PERSAMPLEMEAN for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * PERSAMPLEMEAN + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, eptype,
				eptype_tvar);
  } else {
    WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
					     eptype, eptype_tvar);
  }

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      if (periodstoweighting_.size() == 0) {
	WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, ensemble.first,
				    eptype_tvar, ensemble.first);
      } else {
	WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
						 ensemble.first, eptype_tvar,
						 ensemble.first);
      }
    }
  }

}